

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_misc.c
# Opt level: O2

err_t bignPubkeyCalc(octet *pubkey,bign_params *params,octet *privkey)

{
  word *b;
  size_t count;
  bool_t bVar1;
  err_t eVar2;
  int iVar3;
  size_t sVar4;
  ec_o *ec;
  u64 *dest;
  word *stack;
  
  bVar1 = memIsValid(params,0x150);
  if (bVar1 == 0) {
    eVar2 = 0x6d;
  }
  else {
    bVar1 = bignIsOperable(params);
    if (bVar1 == 0) {
      eVar2 = 0x1f6;
    }
    else {
      sVar4 = bignStart_keep(params->l,bignPubkeyCalc_deep);
      ec = (ec_o *)blobCreate(sVar4);
      if (ec == (ec_o *)0x0) {
        eVar2 = 0x6e;
      }
      else {
        eVar2 = bignStart(ec,params);
        if (eVar2 == 0) {
          sVar4 = ec->f->n;
          count = ec->f->no;
          bVar1 = memIsValid(privkey,count);
          eVar2 = 0x6d;
          if ((bVar1 != 0) && (bVar1 = memIsValid(pubkey,count * 2), bVar1 != 0)) {
            dest = (u64 *)((long)&(ec->hdr).keep + (ec->hdr).keep);
            u64From(dest,privkey,count);
            bVar1 = wwIsZero(dest,sVar4);
            eVar2 = 0x1f8;
            if ((bVar1 == 0) && (iVar3 = wwCmp(dest,ec->order,sVar4), iVar3 < 0)) {
              b = dest + sVar4;
              stack = b + sVar4 * 2;
              bVar1 = ecMulA(b,ec->base,ec,dest,sVar4,stack);
              if (bVar1 == 0) {
                eVar2 = 0x1f6;
              }
              else {
                (*ec->f->to)(pubkey,b,ec->f,stack);
                (*ec->f->to)(pubkey + count,b + sVar4,ec->f,stack);
                eVar2 = 0;
              }
            }
          }
        }
        blobClose(ec);
      }
    }
  }
  return eVar2;
}

Assistant:

err_t bignPubkeyCalc(octet pubkey[], const bign_params* params,
	const octet privkey[])
{
	err_t code;
	size_t no, n;
	// состояние
	void* state;
	ec_o* ec;				/* описание эллиптической кривой */
	word* d;				/* [n] личный ключ */
	word* Q;				/* [2n] открытый ключ */
	void* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (!bignIsOperable(params))
		return ERR_BAD_PARAMS;
	// создать состояние
	state = blobCreate(bignStart_keep(params->l, bignPubkeyCalc_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bignStart(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	no  = ec->f->no;
	n = ec->f->n;
	// проверить входные указатели
	if (!memIsValid(privkey, no) || !memIsValid(pubkey, 2 * no))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	d = objEnd(ec, word);
	Q = d + n;
	stack = Q + 2 * n;
	// загрузить d
	wwFrom(d, privkey, no);
	if (wwIsZero(d, n) || wwCmp(d, ec->order, n) >= 0)
	{
		blobClose(state);
		return ERR_BAD_PRIVKEY;
	}
	// Q <- d G
	if (ecMulA(Q, ec->base, ec, d, n, stack))
	{
		// выгрузить открытый ключ
		qrTo(pubkey, ecX(Q), ec->f, stack);
		qrTo(pubkey + no, ecY(Q, n), ec->f, stack);
	}
	else
		code = ERR_BAD_PARAMS;
	// завершение
	blobClose(state);
	return code;
}